

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O1

send_result_t
zmq::send_multipart<std::array<zmq::message_t,1ul>&,void>
          (socket_ref s,array<zmq::message_t,_1UL> *msgs,send_flags flags)

{
  _Storage<unsigned_long,_true> _Var1;
  _Storage<unsigned_long,_true> _Var2;
  size_t in_RCX;
  undefined4 in_register_00000014;
  ulong uVar3;
  ulong extraout_RDX;
  undefined8 uVar4;
  int in_R8D;
  long lVar5;
  send_result_t sVar6;
  socket_base local_30;
  
  uVar3 = CONCAT44(in_register_00000014,flags);
  lVar5 = 0;
  _Var2._M_value = 0;
  local_30 = s.super_socket_base._handle;
  do {
    _Var1 = _Var2;
    if (lVar5 == 0x40) {
      uVar4 = CONCAT71((int7)(uVar3 >> 8),1);
      goto LAB_001496d2;
    }
    detail::socket_base::send
              (&local_30,(int)msgs + (int)lVar5,(void *)(ulong)((uint)(lVar5 != 0) * 2 | flags),
               in_RCX,in_R8D);
    if ((extraout_RDX & 1) == 0) {
      _Var2 = _Var1;
      if (lVar5 != 0) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::array<zmq::message_t, 1> &]"
                     );
      }
    }
    else {
      lVar5 = lVar5 + 0x40;
      _Var2._M_value = _Var1._M_value + 1;
    }
    uVar3 = extraout_RDX;
  } while ((extraout_RDX & 1) != 0);
  uVar4 = 0;
LAB_001496d2:
  sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (send_result_t)
         sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}